

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

bool test_singly_linked_list(void)

{
  SinglyNodeWithRand *pSVar1;
  ostream *this;
  int local_44;
  char *str;
  SinglyNodeWithRand *intersection_node;
  SinglyNodeWithRand *local_18;
  SinglyNodeWithRand *head2;
  SinglyNodeWithRand *head1;
  
  head2 = (SinglyNodeWithRand *)0x0;
  local_18 = (SinglyNodeWithRand *)0x0;
  si9ma::SinglyLinkedList::insert(&head2,0x17,0);
  si9ma::SinglyLinkedList::insert(&head2,0x22,0);
  si9ma::SinglyLinkedList::insert(&head2,0x13,0);
  si9ma::SinglyLinkedList::insert(&head2,1,0);
  si9ma::SinglyLinkedList::insert(&head2,0x14,0);
  pSVar1 = head2->next->next;
  pSVar1->next->next->next = pSVar1;
  si9ma::SinglyLinkedList::insert(&local_18,99,0);
  si9ma::SinglyLinkedList::insert(&local_18,99,0);
  si9ma::SinglyLinkedList::insert(&local_18,99,0);
  si9ma::SinglyLinkedList::insert(&local_18,0x17,0);
  si9ma::SinglyLinkedList::insert(&local_18,0x1d,0);
  local_18->next->next->next = head2->next->next;
  pSVar1 = si9ma::SinglyLinkedList::get_intersection(head2,local_18);
  if (pSVar1 == (SinglyNodeWithRand *)0x0) {
    local_44 = -1;
  }
  else {
    local_44 = pSVar1->value;
  }
  this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_44);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  si9ma::SinglyLinkedList::delete_list(&head2);
  return true;
}

Assistant:

bool test_singly_linked_list(){
    SinglyNodeWithRand *head1 = nullptr;
    SinglyNodeWithRand *head2 = nullptr;

    try {
        // head1
        SinglyLinkedList::insert(&head1,23);
        SinglyLinkedList::insert(&head1,34);
        SinglyLinkedList::insert(&head1,19);
        SinglyLinkedList::insert(&head1,1);
        SinglyLinkedList::insert(&head1,20);

        head1->next->next->next->next->next = head1->next->next;

        // head2
        SinglyLinkedList::insert(&head2,99);
        SinglyLinkedList::insert(&head2,99);
        SinglyLinkedList::insert(&head2,99);
        SinglyLinkedList::insert(&head2,23);
        SinglyLinkedList::insert(&head2,29);

//        head2->next->next->next->next->next = head2->next->next;

        head2->next->next->next = head1->next->next;

//        /* test code for deep clone*/
//        // bad code ,just for test
//        head->set_rand(head->next->next); // 20 --> 19
//        head->next->set_rand(head->next->next->next); // 1 --> 34
//        head->next->next->next->next->set_rand(head->next); // 23 --> 1
//
//        cout << "\nbefore copy:\n";
//        cout << head->value << "-->" << head->rand->value << endl;
//        cout << head->next->value << "-->" << head->next->rand->value << endl;
//        cout << head->next->next->next->next->value << "-->" << head->next->next->next->next->rand->value << endl;
//
//        auto *head_copy = SinglyLinkedList::deep_clone2(head);
//
//        cout << "\nafter copy:\n";
//        cout << head_copy ->value << "-->" <<  head_copy->rand->value << endl;
//        cout <<  head_copy->next->value << "-->" <<  head_copy->next->rand->value << endl;
//        cout <<  head_copy->next->next->next->next->value << "-->" <<  head_copy->next->next->next->next->rand->value << endl;
//        SinglyLinkedList::delete_list(&head_copy);
//        /* test code for deep clone*/

//        auto *loop_node = SinglyLinkedList::get_loop_node2(head1);
//        cout << (loop_node != nullptr ? loop_node->value : -1) << endl;

        auto *intersection_node = SinglyLinkedList::get_intersection(head1,head2);
        cout << (intersection_node != nullptr ? intersection_node->value : -1) << endl;

        SinglyLinkedList::delete_list(&head1);
        return true;
    }catch (const char * str){
        cout << str << endl;
    }
}